

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  ImVector<ImDrawChannel> *this;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec4 IVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  undefined1 auVar9 [12];
  undefined4 uVar10;
  undefined4 uVar11;
  int iVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  int iVar15;
  ImGuiContext *pIVar16;
  bool bVar17;
  int n;
  uint uVar18;
  int iVar19;
  ImGuiTableColumn *pIVar20;
  ImDrawChannel *pIVar21;
  ImDrawCmd *pIVar22;
  ulong uVar23;
  long lVar24;
  ImDrawChannel *pIVar25;
  ImDrawChannel *pIVar26;
  ImRect *this_00;
  ImBitArray<132> *pIVar27;
  int n_1;
  int iVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  uint uVar32;
  float fVar33;
  float fVar34;
  float fVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar38;
  float fVar39;
  uint local_148;
  ImBitArray<132> remaining_mask;
  ImRect local_d8;
  int iStack_c8;
  ImBitArray<132> local_c4 [7];
  
  pIVar16 = GImGui;
  cVar6 = table->FreezeRowsCount;
  cVar7 = table->FreezeColumnsCount;
  this = &(table->DrawSplitter)._Channels;
  uVar31 = 0;
  memset(&local_d8,0,0xa0);
  local_148 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar31) {
      if (local_148 != 0) {
        ImVector<ImDrawChannel>::resize
                  (&pIVar16->DrawChannelsTempMergeBuffer,(table->DrawSplitter)._Count + -2);
        pIVar21 = (pIVar16->DrawChannelsTempMergeBuffer).Data;
        remaining_mask.Storage[4] = 0;
        remaining_mask.Storage[0] = 0;
        remaining_mask.Storage[1] = 0;
        remaining_mask.Storage[2] = 0;
        remaining_mask.Storage[3] = 0;
        ImBitArraySetBitRange(remaining_mask.Storage,2,(table->DrawSplitter)._Count + -1);
        ImBitArray<132>::ClearBit(&remaining_mask,(uint)table->Bg1DrawChannelUnfrozen);
        if (cVar6 < '\x01') {
          iVar29 = -2;
        }
        else {
          if (table->Bg1DrawChannelUnfrozen == '\x01') {
            __assert_fail("has_freeze_v == false || table->Bg1DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG1_FROZEN"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                          ,0x26e9,"void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *)");
          }
          iVar29 = -3;
        }
        iVar29 = iVar29 + (table->DrawSplitter)._Count;
        fVar33 = (table->HostClipRect).Min.x;
        fVar2 = (table->HostClipRect).Min.y;
        fVar3 = (table->HostClipRect).Max.x;
        fVar4 = (table->HostClipRect).Max.y;
        pIVar27 = local_c4;
        for (uVar31 = 0; uVar31 != 4; uVar31 = uVar31 + 1) {
          lVar24 = uVar31 * 0x28;
          iVar30 = (&iStack_c8)[uVar31 * 10];
          if (iVar30 != 0) {
            fVar34 = *(float *)((long)&local_d8 + lVar24);
            fVar37 = *(float *)((long)&local_d8 + lVar24 + 4);
            fVar38 = *(float *)((long)&local_d8 + lVar24 + 8);
            fVar39 = *(float *)((long)&local_d8 + lVar24 + 0xc);
            if (((uVar31 & 1) == 0 || cVar7 < '\x01') && (fVar33 <= fVar34)) {
              fVar34 = fVar33;
            }
            if ((uVar31 < 2 || cVar6 < '\x01') && (fVar2 <= fVar37)) {
              fVar37 = fVar2;
            }
            if ((uVar31 & 1) != 0) {
              uVar32 = -(uint)(fVar3 <= fVar38);
              fVar38 = (float)(~uVar32 & (uint)fVar3 | (uint)fVar38 & uVar32);
            }
            if ((1 < uVar31) && ((table->Flags & 0x40000) == 0)) {
              uVar32 = -(uint)(fVar4 <= fVar39);
              fVar39 = (float)(~uVar32 & (uint)fVar4 | (uint)fVar39 & uVar32);
            }
            for (lVar24 = 0; lVar24 != 5; lVar24 = lVar24 + 1) {
              remaining_mask.Storage[lVar24] =
                   remaining_mask.Storage[lVar24] & ~pIVar27->Storage[lVar24];
            }
            iVar29 = iVar29 - iVar30;
            iVar28 = 0;
            while ((iVar28 < (table->DrawSplitter)._Count && (iVar30 != 0))) {
              bVar17 = ImBitArray<132>::TestBit(local_c4 + uVar31 * 2,iVar28);
              if (bVar17) {
                ImBitArray<132>::ClearBit(local_c4 + uVar31 * 2,iVar28);
                pIVar25 = ImVector<ImDrawChannel>::operator[](this,iVar28);
                if ((pIVar25->_CmdBuffer).Size != 1) {
LAB_002d7337:
                  __assert_fail("channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                                ,0x2714,"void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *)"
                               );
                }
                pIVar22 = ImVector<ImDrawCmd>::operator[](&pIVar25->_CmdBuffer,0);
                IVar5 = pIVar22->ClipRect;
                auVar36._4_4_ = -(uint)(fVar37 <= IVar5.y);
                auVar36._0_4_ = -(uint)(fVar34 <= IVar5.x);
                auVar9._4_8_ = IVar5._8_8_;
                auVar9._0_4_ = -(uint)(IVar5.y <= fVar37);
                auVar35._0_8_ = auVar9._0_8_ << 0x20;
                auVar35._8_4_ = -(uint)(IVar5.z <= fVar38);
                auVar35._12_4_ = -(uint)(IVar5.w <= fVar39);
                auVar36._8_8_ = auVar35._8_8_;
                iVar19 = movmskps((int)pIVar22,auVar36);
                if (iVar19 != 0xf) goto LAB_002d7337;
                iVar30 = iVar30 + -1;
                pIVar22 = ImVector<ImDrawCmd>::operator[](&pIVar25->_CmdBuffer,0);
                (pIVar22->ClipRect).x = fVar34;
                (pIVar22->ClipRect).y = fVar37;
                (pIVar22->ClipRect).z = fVar38;
                (pIVar22->ClipRect).w = fVar39;
                iVar15 = (pIVar25->_CmdBuffer).Capacity;
                uVar13 = *(undefined4 *)&(pIVar25->_CmdBuffer).Data;
                uVar14 = *(undefined4 *)((long)&(pIVar25->_CmdBuffer).Data + 4);
                iVar19 = (pIVar25->_IdxBuffer).Size;
                iVar12 = (pIVar25->_IdxBuffer).Capacity;
                uVar10 = *(undefined4 *)&(pIVar25->_IdxBuffer).Data;
                uVar11 = *(undefined4 *)((long)&(pIVar25->_IdxBuffer).Data + 4);
                (pIVar21->_CmdBuffer).Size = (pIVar25->_CmdBuffer).Size;
                (pIVar21->_CmdBuffer).Capacity = iVar15;
                *(undefined4 *)&(pIVar21->_CmdBuffer).Data = uVar13;
                *(undefined4 *)((long)&(pIVar21->_CmdBuffer).Data + 4) = uVar14;
                (pIVar21->_IdxBuffer).Size = iVar19;
                (pIVar21->_IdxBuffer).Capacity = iVar12;
                *(undefined4 *)&(pIVar21->_IdxBuffer).Data = uVar10;
                *(undefined4 *)((long)&(pIVar21->_IdxBuffer).Data + 4) = uVar11;
                pIVar21 = pIVar21 + 1;
              }
              iVar28 = iVar28 + 1;
            }
          }
          pIVar25 = pIVar21;
          if (uVar31 == 1 && '\0' < cVar6) {
            pIVar25 = pIVar21 + 1;
            pIVar26 = ImVector<ImDrawChannel>::operator[](this,(uint)table->Bg1DrawChannelUnfrozen);
            iVar19 = (pIVar26->_CmdBuffer).Capacity;
            uVar13 = *(undefined4 *)&(pIVar26->_CmdBuffer).Data;
            uVar14 = *(undefined4 *)((long)&(pIVar26->_CmdBuffer).Data + 4);
            iVar30 = (pIVar26->_IdxBuffer).Size;
            iVar28 = (pIVar26->_IdxBuffer).Capacity;
            uVar10 = *(undefined4 *)&(pIVar26->_IdxBuffer).Data;
            uVar11 = *(undefined4 *)((long)&(pIVar26->_IdxBuffer).Data + 4);
            (pIVar21->_CmdBuffer).Size = (pIVar26->_CmdBuffer).Size;
            (pIVar21->_CmdBuffer).Capacity = iVar19;
            *(undefined4 *)&(pIVar21->_CmdBuffer).Data = uVar13;
            *(undefined4 *)((long)&(pIVar21->_CmdBuffer).Data + 4) = uVar14;
            (pIVar21->_IdxBuffer).Size = iVar30;
            (pIVar21->_IdxBuffer).Capacity = iVar28;
            *(undefined4 *)&(pIVar21->_IdxBuffer).Data = uVar10;
            *(undefined4 *)((long)&(pIVar21->_IdxBuffer).Data + 4) = uVar11;
          }
          pIVar27 = pIVar27 + 2;
          pIVar21 = pIVar25;
        }
        iVar30 = 0;
        while ((iVar28 = (table->DrawSplitter)._Count, iVar30 < iVar28 && (iVar29 != 0))) {
          bVar17 = ImBitArray<132>::TestBit(&remaining_mask,iVar30);
          if (bVar17) {
            pIVar25 = ImVector<ImDrawChannel>::operator[](this,iVar30);
            iVar12 = (pIVar25->_CmdBuffer).Capacity;
            pIVar22 = (pIVar25->_CmdBuffer).Data;
            iVar28 = (pIVar25->_IdxBuffer).Size;
            iVar19 = (pIVar25->_IdxBuffer).Capacity;
            uVar10 = *(undefined4 *)&(pIVar25->_IdxBuffer).Data;
            uVar11 = *(undefined4 *)((long)&(pIVar25->_IdxBuffer).Data + 4);
            (pIVar21->_CmdBuffer).Size = (pIVar25->_CmdBuffer).Size;
            (pIVar21->_CmdBuffer).Capacity = iVar12;
            (pIVar21->_CmdBuffer).Data = pIVar22;
            (pIVar21->_IdxBuffer).Size = iVar28;
            (pIVar21->_IdxBuffer).Capacity = iVar19;
            *(undefined4 *)&(pIVar21->_IdxBuffer).Data = uVar10;
            *(undefined4 *)((long)&(pIVar21->_IdxBuffer).Data + 4) = uVar11;
            pIVar21 = pIVar21 + 1;
            iVar29 = iVar29 + -1;
          }
          iVar30 = iVar30 + 1;
        }
        pIVar25 = (pIVar16->DrawChannelsTempMergeBuffer).Data;
        if (pIVar21 != pIVar25 + (pIVar16->DrawChannelsTempMergeBuffer).Size) {
          __assert_fail("dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                        ,0x2728,"void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *)");
        }
        memcpy((table->DrawSplitter)._Channels.Data + 2,pIVar25,(long)iVar28 * 0x20 - 0x40);
      }
      return;
    }
    if ((table->VisibleUnclippedMaskByIndex >> (uVar31 & 0x3f) & 1) != 0) {
      pIVar20 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)uVar31);
      for (iVar29 = 0; ('\0' < cVar6) + 1 != iVar29; iVar29 = iVar29 + 1) {
        bVar8 = *(byte *)((long)pIVar20 + (0x65 - (ulong)(iVar29 == 0)));
        pIVar21 = ImVector<ImDrawChannel>::operator[](this,(uint)bVar8);
        if (0 < (pIVar21->_CmdBuffer).Size) {
          pIVar22 = ImVector<ImDrawCmd>::back(&pIVar21->_CmdBuffer);
          if (pIVar22->ElemCount == 0) {
            ImVector<ImDrawCmd>::pop_back(&pIVar21->_CmdBuffer);
          }
          if ((pIVar21->_CmdBuffer).Size == 1) {
            if ((pIVar20->Flags & 0x100) == 0) {
              if (cVar6 < '\x01') {
                fVar33 = pIVar20->ContentMaxXUnfrozen;
LAB_002d6eb5:
                uVar32 = -(uint)(pIVar20->ContentMaxXHeadersUsed <= fVar33);
                fVar33 = (float)(~uVar32 & (uint)pIVar20->ContentMaxXHeadersUsed |
                                (uint)fVar33 & uVar32);
              }
              else {
                if (iVar29 == 0) {
                  fVar33 = pIVar20->ContentMaxXFrozen;
                  goto LAB_002d6eb5;
                }
                fVar33 = pIVar20->ContentMaxXUnfrozen;
              }
              pIVar1 = &(pIVar20->ClipRect).Max;
              if (pIVar1->x <= fVar33 && fVar33 != pIVar1->x) goto LAB_002d6f81;
            }
            uVar32 = 1;
            if ('\0' < cVar7) {
              uVar32 = (uint)((long)table->FreezeColumnsCount <= (long)uVar31);
            }
            uVar18 = (uint)(iVar29 != 0) * 2;
            if (cVar6 < '\x01') {
              uVar18 = 2;
            }
            if (0x83 < bVar8) {
              __assert_fail("channel_no < (4 + 64 * 2)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                            ,0x26bd,"void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *)");
            }
            uVar23 = (ulong)(uVar32 | uVar18);
            this_00 = (ImRect *)((long)&local_d8 + uVar23 * 0x28);
            if ((&iStack_c8)[uVar23 * 10] == 0) {
              (this_00->Min).x = 3.4028235e+38;
              (this_00->Min).y = 3.4028235e+38;
              *(undefined8 *)((long)&local_d8 + uVar23 * 0x28 + 8) = 0xff7fffffff7fffff;
            }
            ImBitArray<132>::SetBit(local_c4 + uVar23 * 2,(uint)bVar8);
            (&iStack_c8)[uVar23 * 10] = (&iStack_c8)[uVar23 * 10] + 1;
            pIVar22 = ImVector<ImDrawCmd>::operator[](&pIVar21->_CmdBuffer,0);
            remaining_mask.Storage[0] = (ImU32)(pIVar22->ClipRect).x;
            remaining_mask.Storage[1] = (ImU32)(pIVar22->ClipRect).y;
            remaining_mask.Storage[2] = (ImU32)(pIVar22->ClipRect).z;
            remaining_mask.Storage[3] = (ImU32)(pIVar22->ClipRect).w;
            ImRect::Add(this_00,(ImRect *)&remaining_mask);
            local_148 = local_148 | 1 << (uVar32 | uVar18);
          }
        }
LAB_002d6f81:
      }
      pIVar20->DrawChannelCurrent = 0xff;
    }
    uVar31 = uVar31 + 1;
  } while( true );
}

Assistant:

void    ImGui::TableReorderDrawChannelsForMerge(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = &table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];
    memset(merge_groups, 0, sizeof(merge_groups));

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->VisibleUnclippedMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImU8)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0) and 1 (Bg1 frozen) from the shuffling since they won't move - see channels allocation in TableUpdateDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.ClearBits();
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count - 1);
        remaining_mask.ClearBit(table->Bg1DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg1DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG1_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, ~0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg1DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0 and Bg1 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg1DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}